

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Module::ForEachInst
          (Module *this,function<void_(const_spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  bool bVar1;
  pointer pIVar2;
  Instruction *pIVar3;
  reference this_00;
  pointer this_01;
  reference this_02;
  Instruction *i_12;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__range3;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *i_11;
  const_iterator __end2_11;
  const_iterator __begin2_11;
  vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
  *__range2_11;
  Instruction *i_10;
  const_iterator __end2_10;
  const_iterator __begin2_10;
  InstructionList *__range2_10;
  Instruction *i_9;
  const_iterator __end2_9;
  const_iterator __begin2_9;
  InstructionList *__range2_9;
  Instruction *i_8;
  const_iterator __end2_8;
  const_iterator __begin2_8;
  InstructionList *__range2_8;
  Instruction *i_7;
  const_iterator __end2_7;
  const_iterator __begin2_7;
  InstructionList *__range2_7;
  Instruction *i_6;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  InstructionList *__range2_6;
  Instruction *i_5;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  InstructionList *__range2_5;
  Instruction *i_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  InstructionList *__range2_4;
  Instruction *i_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  InstructionList *__range2_3;
  Instruction *i_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  InstructionList *__range2_2;
  Instruction *i_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  InstructionList *__range2_1;
  Instruction *i;
  const_iterator __end2;
  const_iterator __begin2;
  InstructionList *__range2;
  bool run_on_debug_line_insts_local;
  function<void_(const_spvtools::opt::Instruction_*)> *f_local;
  Module *this_local;
  
  InstructionList::begin((InstructionList *)&__end2);
  InstructionList::end((InstructionList *)&i);
  while (bVar1 = utils::operator!=(&__end2,(iterator_template<const_spvtools::opt::Instruction> *)&i
                                  ), bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2);
  }
  InstructionList::begin((InstructionList *)&__end2_1);
  InstructionList::end((InstructionList *)&i_1);
  while (bVar1 = utils::operator!=(&__end2_1,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_1),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_1);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_1);
  }
  InstructionList::begin((InstructionList *)&__end2_2);
  InstructionList::end((InstructionList *)&i_2);
  while (bVar1 = utils::operator!=(&__end2_2,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_2),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_2);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_2);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->memory_model_);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::get(&this->memory_model_);
    Instruction::ForEachInst(pIVar2,f,run_on_debug_line_insts);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->sampled_image_address_mode_);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::get(&this->sampled_image_address_mode_);
    Instruction::ForEachInst(pIVar2,f,run_on_debug_line_insts);
  }
  InstructionList::begin((InstructionList *)&__end2_3);
  InstructionList::end((InstructionList *)&i_3);
  while (bVar1 = utils::operator!=(&__end2_3,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_3),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_3);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_3);
  }
  InstructionList::begin((InstructionList *)&__end2_4);
  InstructionList::end((InstructionList *)&i_4);
  while (bVar1 = utils::operator!=(&__end2_4,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_4),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_4);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_4);
  }
  InstructionList::begin((InstructionList *)&__end2_5);
  InstructionList::end((InstructionList *)&i_5);
  while (bVar1 = utils::operator!=(&__end2_5,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_5),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_5);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_5);
  }
  InstructionList::begin((InstructionList *)&__end2_6);
  InstructionList::end((InstructionList *)&i_6);
  while (bVar1 = utils::operator!=(&__end2_6,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_6),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_6);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_6);
  }
  InstructionList::begin((InstructionList *)&__end2_7);
  InstructionList::end((InstructionList *)&i_7);
  while (bVar1 = utils::operator!=(&__end2_7,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_7),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_7);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_7);
  }
  InstructionList::begin((InstructionList *)&__end2_8);
  InstructionList::end((InstructionList *)&i_8);
  while (bVar1 = utils::operator!=(&__end2_8,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_8),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_8);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_8);
  }
  InstructionList::begin((InstructionList *)&__end2_9);
  InstructionList::end((InstructionList *)&i_9);
  while (bVar1 = utils::operator!=(&__end2_9,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_9),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_9);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_9);
  }
  InstructionList::begin((InstructionList *)&__end2_10);
  InstructionList::end((InstructionList *)&i_10);
  while (bVar1 = utils::operator!=(&__end2_10,
                                   (iterator_template<const_spvtools::opt::Instruction> *)&i_10),
        bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2_10);
    Instruction::ForEachInst(pIVar3,f,run_on_debug_line_insts);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2_10);
  }
  __end2_11 = std::
              vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              ::begin(&this->functions_);
  i_11 = (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *)
         std::
         vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
         ::end(&this->functions_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_11,
                            (__normal_iterator<const_std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>_>
                             *)&i_11), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>_>
              ::operator*(&__end2_11);
    this_01 = std::
              unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
              get(this_00);
    Function::ForEachInst(this_01,f,run_on_debug_line_insts,true);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>_>
    ::operator++(&__end2_11);
  }
  if (run_on_debug_line_insts) {
    __end3 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
             begin(&this->trailing_dbg_line_info_);
    i_12 = (Instruction *)
           std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::end
                     (&this->trailing_dbg_line_info_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                                       *)&i_12), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<const_spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                ::operator*(&__end3);
      Instruction::ForEachInst(this_02,f,run_on_debug_line_insts);
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void Module::ForEachInst(const std::function<void(const Instruction*)>& f,
                         bool run_on_debug_line_insts) const {
#define DELEGATE(i) i.ForEachInst(f, run_on_debug_line_insts)
  for (auto& i : capabilities_) DELEGATE(i);
  for (auto& i : extensions_) DELEGATE(i);
  for (auto& i : ext_inst_imports_) DELEGATE(i);
  if (memory_model_)
    static_cast<const Instruction*>(memory_model_.get())
        ->ForEachInst(f, run_on_debug_line_insts);
  if (sampled_image_address_mode_)
    static_cast<const Instruction*>(sampled_image_address_mode_.get())
        ->ForEachInst(f, run_on_debug_line_insts);
  for (auto& i : entry_points_) DELEGATE(i);
  for (auto& i : execution_modes_) DELEGATE(i);
  for (auto& i : debugs1_) DELEGATE(i);
  for (auto& i : debugs2_) DELEGATE(i);
  for (auto& i : debugs3_) DELEGATE(i);
  for (auto& i : annotations_) DELEGATE(i);
  for (auto& i : types_values_) DELEGATE(i);
  for (auto& i : ext_inst_debuginfo_) DELEGATE(i);
  for (auto& i : functions_) {
    static_cast<const Function*>(i.get())->ForEachInst(
        f, run_on_debug_line_insts,
        /* run_on_non_semantic_insts = */ true);
  }
  if (run_on_debug_line_insts) {
    for (auto& i : trailing_dbg_line_info_) DELEGATE(i);
  }
#undef DELEGATE
}